

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

bool __thiscall
duckdb::
QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>
::operator()(QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  bool bVar1;
  RESULT_TYPE RVar2;
  RESULT_TYPE RVar3;
  
  RVar2 = QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
          ::operator()(this->accessor_l,lhs);
  RVar3 = QuantileComposed<duckdb::MadAccessor<float,_float,_float>,_duckdb::QuantileIndirect<float>_>
          ::operator()(this->accessor_r,rhs);
  bVar1 = RVar2 < RVar3;
  if (this->desc != false) {
    bVar1 = RVar3 < RVar2;
  }
  return bVar1;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}